

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O3

int cjne_a_mem_offset(em8051 *aCPU)

{
  byte bVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  
  bVar1 = aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U];
  if ((long)(char)bVar1 < 0) {
    if (aCPU->sfrread == (em8051sfrread)0x0) {
      uVar3 = (uint)aCPU->mSFR[(ulong)bVar1 - 0x80];
    }
    else {
      uVar3 = (*aCPU->sfrread)(aCPU,(uint)bVar1);
    }
  }
  else {
    uVar3 = (uint)aCPU->mLowerData[(char)bVar1];
  }
  puVar2 = aCPU->mSFR;
  puVar2[0x50] = ((int)(uint)puVar2[0x60] < (int)uVar3) << 7 | puVar2[0x50] & 0x7f;
  if (uVar3 == aCPU->mSFR[0x60]) {
    iVar4 = aCPU->mPC;
  }
  else {
    iVar4 = (int)(char)aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 2U] +
            aCPU->mPC;
  }
  aCPU->mPC = iVar4 + 3;
  return 1;
}

Assistant:

static int cjne_a_mem_offset(struct em8051 *aCPU)
{
    int address = OPERAND1;
    int value;
    if (address > 0x7f)
    {
        if (aCPU->sfrread)
            value = aCPU->sfrread(aCPU, address);
        else
            value = aCPU->mSFR[address - 0x80];
    }
    else
    {
        value = aCPU->mLowerData[address];
    }  

    if (ACC < value)
    {
        PSW |= PSWMASK_C;
    }
    else
    {
        PSW &= ~PSWMASK_C;
    }

    if (ACC != value)
    {
        PC += (signed char)OPERAND2 + 3;
    }
    else
    {
        PC += 3;
    }
    return 1;
}